

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void Js::DictionaryTypeHandlerBase<int>::TraceFixedFieldsBeforeSetIsProto
               (DynamicObject *instance,DynamicTypeHandler *oldTypeHandler,DynamicType *oldType,
               RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore)

{
  bool bVar1;
  char16_t *local_48;
  DynamicObject *local_40;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore_local;
  DynamicType *oldType_local;
  DynamicTypeHandler *oldTypeHandler_local;
  DynamicObject *instance_local;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,FixMethodPropsPhase);
  if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
    Output::Print(L"FixedFields: PathTypeHandler::SetIsPrototype(0x%p):\n",instance);
    if (oldSingletonInstanceBefore == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_40 = (DynamicObject *)0x0;
    }
    else {
      local_40 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(oldSingletonInstanceBefore);
    }
    Output::Print(L"   before: type = 0x%p, old singleton = 0x%p(0x%p)\n",oldType,
                  oldSingletonInstanceBefore,local_40);
    Output::Print(L"   fixed fields:");
    (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5e])();
    Output::Print(L"\n");
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,FixMethodPropsPhase);
  if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
    Output::Print(L"FixedFields: PathTypeHandler::SetIsPrototype():\n");
    if (oldSingletonInstanceBefore == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_48 = L"==";
    }
    else {
      local_48 = L"!=";
    }
    Output::Print(L"   old singleton before %s null \n",local_48);
    Output::Print(L"   fixed fields before:");
    (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5e])();
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::TraceFixedFieldsBeforeSetIsProto(
        DynamicObject* instance, DynamicTypeHandler* oldTypeHandler, DynamicType* oldType, RecyclerWeakReference<DynamicObject>* oldSingletonInstanceBefore)
    {
        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: PathTypeHandler::SetIsPrototype(0x%p):\n"), instance);
            Output::Print(_u("   before: type = 0x%p, old singleton = 0x%p(0x%p)\n"),
                oldType, oldSingletonInstanceBefore, oldSingletonInstanceBefore != nullptr ? oldSingletonInstanceBefore->Get() : nullptr);
            Output::Print(_u("   fixed fields:"));
            oldTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
        }
        if (PHASE_VERBOSE_TESTTRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: PathTypeHandler::SetIsPrototype():\n"));
            Output::Print(_u("   old singleton before %s null \n"), oldSingletonInstanceBefore == nullptr ? _u("==") : _u("!="));
            Output::Print(_u("   fixed fields before:"));
            oldTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
        }
    }